

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

size_t __thiscall rcg::Buffer::getXPadding(Buffer *this,uint32_t part)

{
  bool bVar1;
  void *stream;
  unsigned_long uVar2;
  
  bVar1 = this->multipart;
  stream = Stream::getHandle(this->parent);
  if (bVar1 == true) {
    uVar2 = anon_unknown_6::getBufferPartValue<unsigned_long>
                      (&this->gentl,stream,this->buffer,part,9);
    return uVar2;
  }
  uVar2 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,stream,this->buffer,0xe);
  return uVar2;
}

Assistant:

size_t Buffer::getXPadding(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_XPADDING);
  }
  else
  {
    return getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_XPADDING);
  }
}